

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComplexTypeInfo.cpp
# Opt level: O0

ContentSpecNode * __thiscall
xercesc_4_0::ComplexTypeInfo::expandContentModel
          (ComplexTypeInfo *this,ContentSpecNode *specNode,int minOccurs,int maxOccurs,
          bool bAllowCompactSyntax)

{
  NodeTypes NVar1;
  ContentSpecNode *pCVar2;
  ComplexTypeInfo *pCVar3;
  ComplexTypeInfo *this_00;
  OutOfMemoryException *anon_var_0;
  int j;
  OutOfMemoryException *anon_var_0_1;
  ContentSpecNode *optional_1;
  int local_60;
  int counter;
  int i_2;
  int i_1;
  ContentSpecNode *optional;
  int i;
  ComplexTypeInfo *local_40;
  ContentSpecNode *retNode;
  ContentSpecNode *saveNode;
  bool bAllowCompactSyntax_local;
  int maxOccurs_local;
  int minOccurs_local;
  ContentSpecNode *specNode_local;
  ComplexTypeInfo *this_local;
  
  if (specNode == (ContentSpecNode *)0x0) {
    this_local = (ComplexTypeInfo *)0x0;
  }
  else {
    local_40 = (ComplexTypeInfo *)specNode;
    if ((minOccurs != 1) || (maxOccurs != 1)) {
      if ((minOccurs == 0) && (maxOccurs == 1)) {
        local_40 = (ComplexTypeInfo *)XMemory::operator_new(0x40,this->fMemoryManager);
        ContentSpecNode::ContentSpecNode
                  ((ContentSpecNode *)local_40,ZeroOrOne,specNode,(ContentSpecNode *)0x0,true,true,
                   this->fMemoryManager);
      }
      else if ((minOccurs == 0) && (maxOccurs == -1)) {
        local_40 = (ComplexTypeInfo *)XMemory::operator_new(0x40,this->fMemoryManager);
        ContentSpecNode::ContentSpecNode
                  ((ContentSpecNode *)local_40,ZeroOrMore,specNode,(ContentSpecNode *)0x0,true,true,
                   this->fMemoryManager);
      }
      else if ((minOccurs == 1) && (maxOccurs == -1)) {
        local_40 = (ComplexTypeInfo *)XMemory::operator_new(0x40,this->fMemoryManager);
        ContentSpecNode::ContentSpecNode
                  ((ContentSpecNode *)local_40,OneOrMore,specNode,(ContentSpecNode *)0x0,true,true,
                   this->fMemoryManager);
      }
      else if ((bAllowCompactSyntax) &&
              ((((NVar1 = ContentSpecNode::getType(specNode), NVar1 == Leaf ||
                 (NVar1 = ContentSpecNode::getType(specNode), (NVar1 & (Any_NS|Any_Other)) == Any))
                || (NVar1 = ContentSpecNode::getType(specNode),
                   (NVar1 & (Any_NS|Any_Other)) == Any_Other)) ||
               (NVar1 = ContentSpecNode::getType(specNode), (NVar1 & (Any_NS|Any_Other)) == Any_NS))
              )) {
        pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
        ContentSpecNode::ContentSpecNode
                  (pCVar2,Loop,specNode,(ContentSpecNode *)0x0,true,true,this->fMemoryManager);
        ContentSpecNode::setMinOccurs(pCVar2,minOccurs);
        ContentSpecNode::setMaxOccurs(pCVar2,maxOccurs);
        if (minOccurs == 0) {
          local_40 = (ComplexTypeInfo *)XMemory::operator_new(0x40,this->fMemoryManager);
          ContentSpecNode::ContentSpecNode
                    ((ContentSpecNode *)local_40,ZeroOrMore,pCVar2,(ContentSpecNode *)0x0,true,true,
                     this->fMemoryManager);
        }
        else {
          local_40 = (ComplexTypeInfo *)XMemory::operator_new(0x40,this->fMemoryManager);
          ContentSpecNode::ContentSpecNode
                    ((ContentSpecNode *)local_40,OneOrMore,pCVar2,(ContentSpecNode *)0x0,true,true,
                     this->fMemoryManager);
        }
      }
      else if (maxOccurs == -1) {
        local_40 = (ComplexTypeInfo *)XMemory::operator_new(0x40,this->fMemoryManager);
        ContentSpecNode::ContentSpecNode
                  ((ContentSpecNode *)local_40,OneOrMore,specNode,(ContentSpecNode *)0x0,true,true,
                   this->fMemoryManager);
        for (optional._0_4_ = 0; (int)optional < minOccurs + -1; optional._0_4_ = (int)optional + 1)
        {
          pCVar3 = (ComplexTypeInfo *)XMemory::operator_new(0x40,this->fMemoryManager);
          ContentSpecNode::ContentSpecNode
                    ((ContentSpecNode *)pCVar3,Sequence,specNode,(ContentSpecNode *)local_40,false,
                     true,this->fMemoryManager);
          local_40 = pCVar3;
        }
      }
      else if (minOccurs == 0) {
        pCVar3 = (ComplexTypeInfo *)XMemory::operator_new(0x40,this->fMemoryManager);
        ContentSpecNode::ContentSpecNode
                  ((ContentSpecNode *)pCVar3,ZeroOrOne,specNode,(ContentSpecNode *)0x0,true,true,
                   this->fMemoryManager);
        local_40 = pCVar3;
        for (counter = 0; counter < maxOccurs + -1; counter = counter + 1) {
          this_00 = (ComplexTypeInfo *)XMemory::operator_new(0x40,this->fMemoryManager);
          ContentSpecNode::ContentSpecNode
                    ((ContentSpecNode *)this_00,Sequence,(ContentSpecNode *)local_40,
                     (ContentSpecNode *)pCVar3,true,false,this->fMemoryManager);
          local_40 = this_00;
        }
      }
      else {
        if (1 < minOccurs) {
          local_40 = (ComplexTypeInfo *)XMemory::operator_new(0x40,this->fMemoryManager);
          ContentSpecNode::ContentSpecNode
                    ((ContentSpecNode *)local_40,Sequence,specNode,specNode,true,false,
                     this->fMemoryManager);
          for (local_60 = 1; local_60 < minOccurs + -1; local_60 = local_60 + 1) {
            pCVar3 = (ComplexTypeInfo *)XMemory::operator_new(0x40,this->fMemoryManager);
            ContentSpecNode::ContentSpecNode
                      ((ContentSpecNode *)pCVar3,Sequence,(ContentSpecNode *)local_40,specNode,true,
                       false,this->fMemoryManager);
            local_40 = pCVar3;
          }
        }
        if (0 < maxOccurs - minOccurs) {
          pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
          ContentSpecNode::ContentSpecNode
                    (pCVar2,ZeroOrOne,specNode,(ContentSpecNode *)0x0,false,true,
                     this->fMemoryManager);
          pCVar3 = (ComplexTypeInfo *)XMemory::operator_new(0x40,this->fMemoryManager);
          ContentSpecNode::ContentSpecNode
                    ((ContentSpecNode *)pCVar3,Sequence,(ContentSpecNode *)local_40,pCVar2,true,true
                     ,this->fMemoryManager);
          local_40 = pCVar3;
          for (anon_var_0._4_4_ = 1; anon_var_0._4_4_ < maxOccurs - minOccurs;
              anon_var_0._4_4_ = anon_var_0._4_4_ + 1) {
            pCVar3 = (ComplexTypeInfo *)XMemory::operator_new(0x40,this->fMemoryManager);
            ContentSpecNode::ContentSpecNode
                      ((ContentSpecNode *)pCVar3,Sequence,(ContentSpecNode *)local_40,pCVar2,true,
                       false,this->fMemoryManager);
            local_40 = pCVar3;
          }
        }
      }
    }
    this_local = local_40;
  }
  return (ContentSpecNode *)this_local;
}

Assistant:

ContentSpecNode* ComplexTypeInfo::expandContentModel(ContentSpecNode* const specNode,
                                                     int minOccurs,
                                                     int maxOccurs,
                                                     bool bAllowCompactSyntax)
{
    if (!specNode) {
        return 0;
    }

    ContentSpecNode* const saveNode = specNode;
    ContentSpecNode* retNode = specNode;

    try
    {
        if (minOccurs == 1 && maxOccurs == 1) {
        }
        else if (minOccurs == 0 && maxOccurs == 1) {

            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::ZeroOrOne
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );
        }
        else if (minOccurs == 0 && maxOccurs == -1) {
            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::ZeroOrMore
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );
        }
        else if (minOccurs == 1 && maxOccurs == -1) {
            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::OneOrMore
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );
        }
        // if what is being repeated is a leaf avoid expanding the tree
        else if(bAllowCompactSyntax &&
            (saveNode->getType()==ContentSpecNode::Leaf ||
            (saveNode->getType() & 0x0f)==ContentSpecNode::Any ||
            (saveNode->getType() & 0x0f)==ContentSpecNode::Any_Other ||
            (saveNode->getType() & 0x0f)==ContentSpecNode::Any_NS))
        {
            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::Loop
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );
            retNode->setMinOccurs(minOccurs);
            retNode->setMaxOccurs(maxOccurs);

            if(minOccurs==0)
                retNode = new (fMemoryManager) ContentSpecNode
                (
                    ContentSpecNode::ZeroOrMore
                    , retNode
                    , 0
                    , true
                    , true
                    , fMemoryManager
                );
            else
                retNode = new (fMemoryManager) ContentSpecNode
                (
                    ContentSpecNode::OneOrMore
                    , retNode
                    , 0
                    , true
                    , true
                    , fMemoryManager
                );

        }
        else if (maxOccurs == -1) {

            retNode = new (fMemoryManager) ContentSpecNode
            (
                ContentSpecNode::OneOrMore
                , retNode
                , 0
                , true
                , true
                , fMemoryManager
            );

            for (int i=0; i < (minOccurs-1); i++) {
                retNode = new (fMemoryManager) ContentSpecNode
                (
                    ContentSpecNode::Sequence
                    , saveNode
                    , retNode
                    , false
                    , true
                    , fMemoryManager
                );
            }
        }
        else {

            if (minOccurs == 0) {

                ContentSpecNode* optional = new (fMemoryManager) ContentSpecNode
                (
                    ContentSpecNode::ZeroOrOne
                    , saveNode
                    , 0
                    , true
                    , true
                    , fMemoryManager
                );

                retNode = optional;

                for (int i=0; i < (maxOccurs-1); i++) {
                    retNode = new (fMemoryManager) ContentSpecNode
                    (
                        ContentSpecNode::Sequence
                        , retNode
                        , optional
                        , true
                        , false
                        , fMemoryManager
                    );
                }
            }
            else {

                if (minOccurs > 1) {

                    retNode = new (fMemoryManager) ContentSpecNode
                    (
                        ContentSpecNode::Sequence
                        , retNode
                        , saveNode
                        , true
                        , false
                        , fMemoryManager
                    );

                    for (int i=1; i < (minOccurs-1); i++) {
                        retNode = new (fMemoryManager) ContentSpecNode
                        (
                            ContentSpecNode::Sequence
                            , retNode
                            , saveNode
                            , true
                            , false
                            , fMemoryManager
                        );
                    }
                }

                int counter = maxOccurs-minOccurs;

                if (counter > 0) {

                    ContentSpecNode* optional = new (fMemoryManager) ContentSpecNode
                    (
                        ContentSpecNode::ZeroOrOne
                        , saveNode
                        , 0
                        , false
                        , true
                        , fMemoryManager
                    );

                    try
                    {
                        retNode = new (fMemoryManager) ContentSpecNode
                        (
                            ContentSpecNode::Sequence
                            , retNode
                            , optional
                            , true
                            , true
                            , fMemoryManager
                        );
                    }
                    catch( const OutOfMemoryException& )
                    {
                        delete optional;
                        throw;
                    }

                    for (int j=1; j < counter; j++) {

                        retNode = new (fMemoryManager) ContentSpecNode
                        (
                            ContentSpecNode::Sequence
                            , retNode
                            , optional
                            , true
                            , false
                            , fMemoryManager
                        );
                    }
                }
            }
        }
    }
    catch( const OutOfMemoryException& )
    {
        delete retNode;
        throw;
    }

    return retNode;
}